

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeError(ExpressionContext *ctx,SynError *syntax)

{
  ExprError *this;
  TypeBase *type;
  SynError *syntax_local;
  ExpressionContext *ctx_local;
  
  this = ExpressionContext::get<ExprError>(ctx);
  type = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
  ExprError::ExprError(this,&syntax->super_SynBase,type);
  return &this->super_ExprBase;
}

Assistant:

ExprBase* AnalyzeError(ExpressionContext &ctx, SynError *syntax)
{
	return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType());
}